

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# guild.cpp
# Opt level: O1

void __thiscall Guild::DelMember(Guild *this,string *kicked,Character *kicker,bool alert)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  World *pWVar2;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  size_t sVar5;
  long lVar6;
  long *plVar7;
  bool bVar8;
  int iVar9;
  int iVar10;
  mapped_type *this_00;
  long *plVar11;
  size_type *psVar12;
  _List_node_base *p_Var13;
  iterator __position;
  string msg;
  string local_140;
  string local_120;
  string local_100;
  World *local_e0;
  _List_node_base *local_d8;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  Database_Result local_50;
  
  util::lowercase(&local_100,kicked);
  std::__cxx11::string::operator=((string *)kicked,(string *)&local_100);
  paVar1 = &local_100.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != paVar1) {
    operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
  }
  if (alert) {
    pWVar2 = this->manager->world;
    local_100._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"GuildAnnounce","");
    this_00 = std::__detail::
              _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)&pWVar2->config,&local_100);
    bVar8 = util::variant::GetBool(this_00);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != paVar1) {
      operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    bVar8 = false;
  }
  if (bVar8 != false) {
    pWVar2 = this->manager->world;
    paVar1 = &local_140.field_2;
    local_140._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_140,"guild_leave","");
    util::ucfirst(&local_120,kicked);
    I18N::Format<std::__cxx11::string>(&local_d0,&pWVar2->i18n,&local_140,&local_120);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != &local_120.field_2) {
      operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != paVar1) {
      operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
    }
    if (kicker != (Character *)0x0) {
      pWVar2 = this->manager->world;
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"guild_kick","");
      util::ucfirst(&local_70,&kicker->real_name);
      I18N::Format<std::__cxx11::string>(&local_120,&pWVar2->i18n,&local_90,&local_70);
      plVar11 = (long *)std::__cxx11::string::replace((ulong)&local_120,0,(char *)0x0,0x1d894e);
      psVar12 = (size_type *)(plVar11 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar11 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar12) {
        local_140.field_2._M_allocated_capacity = *psVar12;
        local_140.field_2._8_8_ = plVar11[3];
        local_140._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_140.field_2._M_allocated_capacity = *psVar12;
        local_140._M_dataplus._M_p = (pointer)*plVar11;
      }
      local_140._M_string_length = plVar11[1];
      *plVar11 = (long)psVar12;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      std::__cxx11::string::_M_append((char *)&local_d0,(ulong)local_140._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_140._M_dataplus._M_p != paVar1) {
        operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_120._M_dataplus._M_p != &local_120.field_2) {
        operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
    }
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b0,local_d0._M_dataplus._M_p,
               local_d0._M_dataplus._M_p + local_d0._M_string_length);
    Msg(this,(Character *)0x0,&local_b0,true);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
  }
  __position._M_current =
       (this->members).
       super__Vector_base<std::shared_ptr<Guild_Member>,_std::allocator<std::shared_ptr<Guild_Member>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  if (__position._M_current !=
      (this->members).
      super__Vector_base<std::shared_ptr<Guild_Member>,_std::allocator<std::shared_ptr<Guild_Member>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      while( true ) {
        peVar3 = ((__position._M_current)->
                 super___shared_ptr<Guild_Member,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        p_Var4 = ((__position._M_current)->
                 super___shared_ptr<Guild_Member,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
        if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
          }
        }
        sVar5 = (peVar3->name)._M_string_length;
        if (sVar5 == kicked->_M_string_length) {
          if (sVar5 == 0) {
            bVar8 = true;
          }
          else {
            iVar9 = bcmp((peVar3->name)._M_dataplus._M_p,(kicked->_M_dataplus)._M_p,sVar5);
            bVar8 = iVar9 == 0;
          }
        }
        else {
          bVar8 = false;
        }
        if (!bVar8) break;
        std::vector<std::shared_ptr<Guild_Member>,_std::allocator<std::shared_ptr<Guild_Member>_>_>
        ::_M_erase(&this->members,__position);
        if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
        }
        __position._M_current = __position._M_current + 1;
        if (bVar8 || __position._M_current ==
                     (this->members).
                     super__Vector_base<std::shared_ptr<Guild_Member>,_std::allocator<std::shared_ptr<Guild_Member>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish) goto LAB_00183fd4;
      }
      if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
      }
      __position._M_current = __position._M_current + 1;
    } while (__position._M_current !=
             (this->members).
             super__Vector_base<std::shared_ptr<Guild_Member>,_std::allocator<std::shared_ptr<Guild_Member>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
LAB_00183fd4:
  local_e0 = this->manager->world;
  p_Var13 = (_List_node_base *)&(local_e0->server->super_Server).clients;
  local_d8 = p_Var13;
  do {
    p_Var13 = (((_List_base<Client_*,_std::allocator<Client_*>_> *)&p_Var13->_M_next)->_M_impl).
              _M_node.super__List_node_base._M_next;
    if (p_Var13 == local_d8) {
      Database::Query(&local_50,&local_e0->db,
                      "UPDATE `characters` SET `guild` = NULL, `guild_rank` = NULL, `guild_rank_string` = NULL WHERE `name` = \'$\'"
                      ,(kicked->_M_dataplus)._M_p);
      std::
      vector<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>_>_>
      ::~vector(&local_50.
                 super_vector<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>_>_>
               );
      return;
    }
    lVar6 = *(long *)((long)p_Var13[1]._M_next + 0x108);
    if (lVar6 == 0) {
LAB_001840c6:
      iVar9 = 0;
    }
    else {
      plVar7 = *(long **)(lVar6 + 0x58);
      for (plVar11 = *(long **)(lVar6 + 0x50); plVar11 != plVar7; plVar11 = plVar11 + 1) {
        lVar6 = *plVar11;
        sVar5 = *(size_t *)(lVar6 + 0x20);
        iVar9 = 0;
        bVar8 = false;
        if (sVar5 == kicked->_M_string_length) {
          if (sVar5 == 0) {
            bVar8 = true;
          }
          else {
            iVar10 = bcmp(*(void **)(lVar6 + 0x18),(kicked->_M_dataplus)._M_p,sVar5);
            bVar8 = iVar10 == 0;
          }
        }
        if (bVar8) {
          p_Var4 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar6 + 0x3f0);
          *(undefined8 *)(lVar6 + 1000) = 0;
          *(undefined8 *)(lVar6 + 0x3f0) = 0;
          if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
          }
          *(undefined1 *)(lVar6 + 0x408) = 0;
          *(undefined8 *)(lVar6 + 0x418) = 0;
          **(undefined1 **)(lVar6 + 0x410) = 0;
          iVar9 = 7;
          if (*(char *)(lVar6 + 0xc) != '\0') {
            iVar9 = 1;
          }
        }
        if (bVar8) goto LAB_001840c0;
      }
      iVar9 = 7;
LAB_001840c0:
      if (iVar9 == 7) goto LAB_001840c6;
    }
    if (iVar9 != 0) {
      return;
    }
  } while( true );
}

Assistant:

void Guild::DelMember(std::string kicked, Character *kicker, bool alert)
{
	kicked = util::lowercase(kicked);

	if (alert && this->manager->world->config["GuildAnnounce"])
	{
		std::string msg = manager->world->i18n.Format("guild_leave", util::ucfirst(kicked));

		if (kicker)
			msg += " " + manager->world->i18n.Format("guild_kick", util::ucfirst(kicker->real_name));

		this->Msg(0, msg);
	}

	UTIL_IFOREACH(this->members, it)
	{
		std::shared_ptr<Guild_Member> member = *it;

		if (member->name == kicked)
		{
			this->members.erase(it);
			break;
		}
	}

	World* world = this->manager->world;

	UTIL_FOREACH(world->server->clients, client)
	{
		EOClient *eoclient = static_cast<EOClient *>(client);

		if (eoclient->player)
		{
			UTIL_FOREACH(eoclient->player->characters, character)
			{
				if (character->real_name == kicked)
				{
					character->guild.reset();
					character->guild_rank = 0;
					character->guild_rank_string.clear();
					// *this may not be valid after this point

					if (character->online)
						return;
					else
						break;
				}
			}
		}
	}

	world->db.Query("UPDATE `characters` SET `guild` = NULL, `guild_rank` = NULL, `guild_rank_string` = NULL WHERE `name` = '$'", kicked.c_str());
}